

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O3

void __thiscall
CRenderTools::RenderTee
          (CRenderTools *this,CAnimState *pAnim,CTeeRenderInfo *pInfo,int Emote,vec2 Dir,vec2 Pos)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  int iVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  char cVar13;
  uint uVar14;
  ulong uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_88;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_84;
  undefined8 local_58;
  float local_50;
  float local_4c;
  undefined8 local_48;
  float local_40;
  float local_3c;
  long local_38;
  int iVar15;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (pInfo->m_BotTexture).m_Id;
  bVar18 = iVar5 < 0;
  lVar8 = 0x24;
  if (bVar18) {
    lVar8 = 0x84;
  }
  lVar9 = 0x28;
  if (bVar18) {
    lVar9 = 0x88;
  }
  lVar10 = 0x2c;
  if (bVar18) {
    lVar10 = 0x8c;
  }
  lVar11 = 0x30;
  if (bVar18) {
    lVar11 = 0x90;
  }
  uVar14 = 1;
  bVar18 = false;
  do {
    bVar7 = false;
    bVar17 = true;
    do {
      bVar6 = bVar17;
      fVar1 = pInfo->m_Size;
      fVar19 = fVar1 * 0.015625;
      local_88 = Pos.field_0;
      aStack_84 = Pos.field_1;
      if (bVar7) {
        uVar2 = (pAnim->m_Body).m_X;
        uVar4 = (pAnim->m_Body).m_Y;
        fVar22 = (float)uVar2 * fVar19 + local_88.x;
        fVar23 = (float)uVar4 * fVar19 + aStack_84.y;
        if (-1 < iVar5 && (char)uVar14 == '\0') {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                    (this->m_pGraphics,(ulong)(uint)(pInfo->m_BotTexture).m_Id);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          if (0x5b < g_pData->m_NumSprites) {
            SelectSprite(this,g_pData->m_aSprites + 0x5b,0,0,0);
          }
          fVar20 = fVar19 * 0.6666667 + fVar22;
          fVar21 = fVar19 * -15.333333 + fVar23;
          local_48 = CONCAT44(fVar21,fVar20);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                    (this->m_pGraphics,(ulong)(uint)(pInfo->m_BotTexture).m_Id);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          if (0x5a < g_pData->m_NumSprites) {
            SelectSprite(this,g_pData->m_aSprites + 0x5a,0,0,0);
          }
          local_48 = CONCAT44(fVar21,fVar20);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    ((pInfo->m_BotColor).field_0.x,(pInfo->m_BotColor).field_1.y,
                     (pInfo->m_BotColor).field_2.z,(pInfo->m_BotColor).field_3.w);
          if (0x59 < g_pData->m_NumSprites) {
            SelectSprite(this,g_pData->m_aSprites + 0x59,0,0,0);
          }
          local_48 = CONCAT44(fVar21,fVar20);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        }
        if (-1 < pInfo->m_aTextures[2].m_Id) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          fVar20 = (pAnim->m_Body).m_Angle * 3.1415927;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar20 + fVar20);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (pInfo->m_aColors[2].field_0.x,pInfo->m_aColors[2].field_1.y,
                     pInfo->m_aColors[2].field_2.z,pInfo->m_aColors[2].field_3.w);
          if ((int)(uVar14 | 0x4a) < g_pData->m_NumSprites) {
            SelectSprite(this,(CDataSprite *)
                              ((long)&g_pData->m_aSprites->m_pName + (ulong)((uVar14 | 0x4a) << 5)),
                         0,0,0);
          }
          local_48 = CONCAT44(fVar23,fVar22);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                  (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[0].m_Id);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
        fVar20 = (pAnim->m_Body).m_Angle * 3.1415927;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar20 + fVar20);
        if (uVar14 == 0) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (pInfo->m_aColors[0].field_0.x,pInfo->m_aColors[0].field_1.y,
                     pInfo->m_aColors[0].field_2.z,pInfo->m_aColors[0].field_3.w);
          lVar12 = 0x8c0;
          if (0x46 < g_pData->m_NumSprites) goto LAB_00188628;
        }
        else {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          lVar12 = 0x8a0;
          if (0x45 < g_pData->m_NumSprites) {
LAB_00188628:
            SelectSprite(this,(CDataSprite *)((long)&g_pData->m_aSprites->m_pName + lVar12),0,0,0);
          }
        }
        local_48 = CONCAT44(fVar23,fVar22);
        local_40 = fVar1;
        local_3c = fVar1;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                  (this->m_pGraphics,&local_48,1);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        if (pInfo->m_aTextures[1].m_Id < 0 || uVar14 != 0) {
          if (uVar14 == 0) goto LAB_00188780;
        }
        else {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          fVar20 = (pAnim->m_Body).m_Angle * 3.1415927;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar20 + fVar20);
          fVar20 = pInfo->m_aColors[1].field_3.w;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (pInfo->m_aColors[1].field_0.x * fVar20,pInfo->m_aColors[1].field_1.y * fVar20,
                     pInfo->m_aColors[1].field_2.z * fVar20);
          if (0x49 < g_pData->m_NumSprites) {
            SelectSprite(this,g_pData->m_aSprites + 0x49,0,0,0);
          }
          local_48 = CONCAT44(fVar23,fVar22);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
LAB_00188780:
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                    (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[0].m_Id);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          fVar20 = (pAnim->m_Body).m_Angle * 3.1415927;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar20 + fVar20);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          iVar15 = 1;
          do {
            cVar13 = (char)iVar15;
            if (0x48 - iVar15 < g_pData->m_NumSprites) {
              SelectSprite(this,(CDataSprite *)
                                ((long)&g_pData->m_aSprites->m_pName +
                                (ulong)(uint)((0x48 - iVar15) * 0x20)),0,0,0);
            }
            local_48 = CONCAT44(fVar23,fVar22);
            local_40 = fVar1;
            local_3c = fVar1;
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                      (this->m_pGraphics,&local_48,1);
            iVar15 = 0;
          } while (cVar13 != '\0');
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                  (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[5].m_Id);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
        fVar20 = (pAnim->m_Body).m_Angle * 3.1415927;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar20 + fVar20);
        if (-1 < iVar5) {
          Emote = 3;
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                  (*(undefined4 *)((long)&pInfo->m_aTextures[0].m_Id + lVar8),
                   *(undefined4 *)((long)&pInfo->m_aTextures[0].m_Id + lVar9),
                   *(undefined4 *)((long)&pInfo->m_aTextures[0].m_Id + lVar10),
                   *(undefined4 *)((long)&pInfo->m_aTextures[0].m_Id + lVar11));
        if (bVar18) {
          iVar15 = g_pData->m_NumSprites;
          switch(Emote) {
          case 1:
            lVar12 = 0xa40;
            if (0x52 < iVar15) {
LAB_0018894d:
              SelectSprite(this,(CDataSprite *)((long)&g_pData->m_aSprites->m_pName + lVar12),0,0,0)
              ;
            }
            break;
          case 2:
            lVar12 = 0xa60;
            if (0x53 < iVar15) goto LAB_0018894d;
            break;
          case 3:
            lVar12 = 0xa80;
            if (0x54 < iVar15) goto LAB_0018894d;
            break;
          case 4:
            lVar12 = 0xa20;
            if (0x51 < iVar15) goto LAB_0018894d;
            break;
          default:
            lVar12 = 0xa00;
            if (0x50 < iVar15) goto LAB_0018894d;
          }
          local_50 = fVar1 * 0.6;
          local_4c = fVar1 * 0.15;
          if (Emote != 5) {
            local_4c = local_50;
          }
          local_4c = local_4c * 0.5;
          local_58 = CONCAT44(fVar1 * (Dir.field_1.y * 0.1 + -0.05) + fVar23,
                              fVar1 * Dir.field_0.x * 0.125 + fVar22);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_58,1);
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        if ((uVar14 == 0) && (-1 < (pInfo->m_HatTexture).m_Id)) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          fVar20 = (pAnim->m_Body).m_Angle * 3.1415927;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar20 + fVar20);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          switch(pInfo->m_HatSpriteIndex) {
          case 0:
            lVar12 = 0xaa0;
            if (0x55 < g_pData->m_NumSprites) {
LAB_00188ac9:
              SelectSprite(this,(CDataSprite *)((long)&g_pData->m_aSprites->m_pName + lVar12),
                           (uint)(Dir.field_0.x < 0.0) * 2,0,0);
            }
            break;
          case 1:
            lVar12 = 0xac0;
            if (0x56 < g_pData->m_NumSprites) goto LAB_00188ac9;
            break;
          case 2:
            lVar12 = 0xae0;
            if (0x57 < g_pData->m_NumSprites) goto LAB_00188ac9;
            break;
          case 3:
            lVar12 = 0xb00;
            if (0x58 < g_pData->m_NumSprites) goto LAB_00188ac9;
          }
          local_48 = CONCAT44(fVar23,fVar22);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        }
      }
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[4].m_Id);
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
      uVar16 = (ulong)(((byte)~bVar6 & 1) << 4);
      fVar22 = *(float *)((long)&(pAnim->m_BackFoot).m_Angle + uVar16) * 3.1415927;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar22 + fVar22);
      if (uVar14 == 0) {
        fVar22 = 1.0;
        if (pInfo->m_GotAirJump == 0) {
          fVar22 = *(float *)(&DAT_001d9ae4 +
                             (ulong)(this->m_pConfig->m_ClAirjumpindicator == 0) * 4);
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                  (pInfo->m_aColors[4].field_0.x * fVar22,pInfo->m_aColors[4].field_1.y * fVar22,
                   fVar22 * pInfo->m_aColors[4].field_2.z,pInfo->m_aColors[4].field_3.w);
        lVar12 = 0x9c0;
        if (0x4e < g_pData->m_NumSprites) goto LAB_00188c2e;
      }
      else {
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                  (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
        lVar12 = 0x9e0;
        if (0x4f < g_pData->m_NumSprites) {
LAB_00188c2e:
          SelectSprite(this,(CDataSprite *)((long)&g_pData->m_aSprites->m_pName + lVar12),0,0,0);
        }
      }
      uVar3 = *(undefined8 *)((long)&(pAnim->m_BackFoot).m_X + uVar16);
      local_48 = CONCAT44(fVar19 * (float)((ulong)uVar3 >> 0x20) + aStack_84.y,
                          fVar19 * (float)uVar3 + local_88.x);
      local_40 = fVar1 / 2.1;
      local_3c = fVar1 / 2.1;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_48,1)
      ;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
      bVar7 = true;
      bVar17 = false;
    } while (bVar6);
    bVar18 = true;
    bVar17 = uVar14 == 0;
    uVar14 = 0;
    if (bVar17) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void CRenderTools::RenderTee(CAnimState *pAnim, const CTeeRenderInfo *pInfo, int Emote, vec2 Dir, vec2 Pos)
{
	vec2 Direction = Dir;
	vec2 Position = Pos;
	bool IsBot = pInfo->m_BotTexture.IsValid();

	// first pass we draw the outline
	// second pass we draw the filling
	for(int p = 0; p < 2; p++)
	{
		bool OutLine = p==0;

		for(int f = 0; f < 2; f++)
		{
			float AnimScale = pInfo->m_Size * 1.0f/64.0f;
			float BaseSize = pInfo->m_Size;
			if(f == 1)
			{
				vec2 BodyPos = Position + vec2(pAnim->GetBody()->m_X, pAnim->GetBody()->m_Y)*AnimScale;
				IGraphics::CQuadItem BodyItem(BodyPos.x, BodyPos.y, BaseSize, BaseSize);
				IGraphics::CQuadItem BotItem(BodyPos.x+(2.f/3.f)*AnimScale, BodyPos.y+(-16+2.f/3.f)*AnimScale, BaseSize, BaseSize); // x+0.66, y+0.66 to correct some rendering bug
				IGraphics::CQuadItem Item;

				// draw bot visuals (background)
				if(IsBot && !OutLine)
				{
					Graphics()->TextureSet(pInfo->m_BotTexture);
					Graphics()->QuadsBegin();
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					SelectSprite(SPRITE_TEE_BOT_BACKGROUND, 0, 0, 0);
					Item = BotItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw bot visuals (foreground)
				if(IsBot && !OutLine)
				{
					Graphics()->TextureSet(pInfo->m_BotTexture);
					Graphics()->QuadsBegin();
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					SelectSprite(SPRITE_TEE_BOT_FOREGROUND, 0, 0, 0);
					Item = BotItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->SetColor(pInfo->m_BotColor.r, pInfo->m_BotColor.g, pInfo->m_BotColor.b, pInfo->m_BotColor.a);
					SelectSprite(SPRITE_TEE_BOT_GLOW, 0, 0, 0);
					Item = BotItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw decoration
				if(pInfo->m_aTextures[SKINPART_DECORATION].IsValid())
				{
					Graphics()->TextureSet(pInfo->m_aTextures[2]);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_DECORATION].r, pInfo->m_aColors[SKINPART_DECORATION].g, pInfo->m_aColors[SKINPART_DECORATION].b, pInfo->m_aColors[SKINPART_DECORATION].a);
					SelectSprite(OutLine?SPRITE_TEE_DECORATION_OUTLINE:SPRITE_TEE_DECORATION, 0, 0, 0);
					Item = BodyItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw body (behind marking)
				Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_BODY]);
				Graphics()->QuadsBegin();
				Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
				if(OutLine)
				{
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					SelectSprite(SPRITE_TEE_BODY_OUTLINE, 0, 0, 0);
				}
				else
				{
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_BODY].r, pInfo->m_aColors[SKINPART_BODY].g, pInfo->m_aColors[SKINPART_BODY].b, pInfo->m_aColors[SKINPART_BODY].a);
					SelectSprite(SPRITE_TEE_BODY, 0, 0, 0);
				}
				Item = BodyItem;
				Graphics()->QuadsDraw(&Item, 1);
				Graphics()->QuadsEnd();

				// draw marking
				if(pInfo->m_aTextures[SKINPART_MARKING].IsValid() && !OutLine)
				{
					Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_MARKING]);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_MARKING].r*pInfo->m_aColors[SKINPART_MARKING].a, pInfo->m_aColors[SKINPART_MARKING].g*pInfo->m_aColors[SKINPART_MARKING].a,
						pInfo->m_aColors[SKINPART_MARKING].b*pInfo->m_aColors[SKINPART_MARKING].a, pInfo->m_aColors[SKINPART_MARKING].a);
					SelectSprite(SPRITE_TEE_MARKING, 0, 0, 0);
					Item = BodyItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw body (in front of marking)
				if(!OutLine)
				{
					Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_BODY]);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					for(int t = 0; t < 2; t++)
					{
						SelectSprite(t==0?SPRITE_TEE_BODY_SHADOW:SPRITE_TEE_BODY_UPPER_OUTLINE, 0, 0, 0);
						Item = BodyItem;
						Graphics()->QuadsDraw(&Item, 1);
					}
					Graphics()->QuadsEnd();
				}

				// draw eyes
				Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_EYES]);
				Graphics()->QuadsBegin();
				Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
				if(IsBot)
				{
					Graphics()->SetColor(pInfo->m_BotColor.r, pInfo->m_BotColor.g, pInfo->m_BotColor.b, pInfo->m_BotColor.a);
					Emote = EMOTE_SURPRISE;
				}
				else
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_EYES].r, pInfo->m_aColors[SKINPART_EYES].g, pInfo->m_aColors[SKINPART_EYES].b, pInfo->m_aColors[SKINPART_EYES].a);
				if(p == 1)
				{
					switch (Emote)
					{
						case EMOTE_PAIN:
							SelectSprite(SPRITE_TEE_EYES_PAIN, 0, 0, 0);
							break;
						case EMOTE_HAPPY:
							SelectSprite(SPRITE_TEE_EYES_HAPPY, 0, 0, 0);
							break;
						case EMOTE_SURPRISE:
							SelectSprite(SPRITE_TEE_EYES_SURPRISE, 0, 0, 0);
							break;
						case EMOTE_ANGRY:
							SelectSprite(SPRITE_TEE_EYES_ANGRY, 0, 0, 0);
							break;
						default:
							SelectSprite(SPRITE_TEE_EYES_NORMAL, 0, 0, 0);
							break;
					}

					float EyeScale = BaseSize*0.60f;
					float h = Emote == EMOTE_BLINK ? BaseSize*0.15f/2.0f : EyeScale/2.0f;
					vec2 Offset = vec2(Direction.x*0.125f, -0.05f+Direction.y*0.10f)*BaseSize;
					IGraphics::CQuadItem QuadItem(BodyPos.x+Offset.x, BodyPos.y+Offset.y, EyeScale, h);
					Graphics()->QuadsDraw(&QuadItem, 1);
				}
				Graphics()->QuadsEnd();
				
				// draw xmas hat
				if(!OutLine && pInfo->m_HatTexture.IsValid())
				{
					Graphics()->TextureSet(pInfo->m_HatTexture);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi * 2);
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					int Flag = Direction.x < 0.0f ? SPRITE_FLAG_FLIP_X : 0;
					switch(pInfo->m_HatSpriteIndex)
					{
					case 0:
						SelectSprite(SPRITE_TEE_HATS_TOP1, Flag, 0, 0);
						break;
					case 1:
						SelectSprite(SPRITE_TEE_HATS_TOP2, Flag, 0, 0);
						break;
					case 2:
						SelectSprite(SPRITE_TEE_HATS_SIDE1, Flag, 0, 0);
						break;
					case 3:
						SelectSprite(SPRITE_TEE_HATS_SIDE2, Flag, 0, 0);
					}
					Item = BodyItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}
			}

			// draw feet
			Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_FEET]);
			Graphics()->QuadsBegin();
			CAnimKeyframe *pFoot = f ? pAnim->GetFrontFoot() : pAnim->GetBackFoot();

			float w = BaseSize/2.1f;
			float h = w;

			Graphics()->QuadsSetRotation(pFoot->m_Angle*pi*2);

			if(OutLine)
			{
				Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
				SelectSprite(SPRITE_TEE_FOOT_OUTLINE, 0, 0, 0);
			}
			else
			{
				bool Indicate = !pInfo->m_GotAirJump && m_pConfig->m_ClAirjumpindicator;
				float cs = 1.0f; // color scale
				if(Indicate)
					cs = 0.5f;
				Graphics()->SetColor(pInfo->m_aColors[SKINPART_FEET].r*cs, pInfo->m_aColors[SKINPART_FEET].g*cs, pInfo->m_aColors[SKINPART_FEET].b*cs, pInfo->m_aColors[SKINPART_FEET].a);
				SelectSprite(SPRITE_TEE_FOOT, 0, 0, 0);
			}

			IGraphics::CQuadItem QuadItem(Position.x+pFoot->m_X*AnimScale, Position.y+pFoot->m_Y*AnimScale, w, h);
			Graphics()->QuadsDraw(&QuadItem, 1);
			Graphics()->QuadsEnd();
		}
	}
}